

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

size_t __thiscall anon_unknown.dwarf_2a1b1f::ConstPubkeyProvider::GetSize(ConstPubkeyProvider *this)

{
  size_t sVar1;
  byte bVar2;
  long in_FS_OFFSET;
  
  bVar2 = (this->super_PubkeyProvider).field_0xc;
  sVar1 = 0x21;
  if ((bVar2 & 0xfe) != 2) {
    bVar2 = bVar2 - 4;
    if (bVar2 < 4) {
      sVar1 = (&DAT_00257990)[bVar2];
    }
    else {
      sVar1 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return sVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t GetSize() const override { return m_pubkey.size(); }